

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

LValue * __thiscall
slang::ast::SimpleAssignmentPatternExpression::evalLValueImpl
          (SimpleAssignmentPatternExpression *this,EvalContext *context)

{
  bool bVar1;
  reference ppEVar2;
  AssignmentPatternExpressionBase *in_RSI;
  LValue *in_RDI;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar3;
  Kind lvalKind;
  LValue lval;
  Expression *elem;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range2;
  vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> lvals;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_fffffffffffffd88;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  Expression *in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  AssignmentExpression *in_stack_fffffffffffffdb0;
  Kind kind;
  size_type in_stack_fffffffffffffdb8;
  vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> *in_stack_fffffffffffffdc0;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_70;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_68;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_58;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_40;
  
  std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>::vector
            ((vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> *)0x9c2406);
  local_40 = AssignmentPatternExpressionBase::elements(in_RSI);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0x9c2443);
  std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>::reserve
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  sVar3 = AssignmentPatternExpressionBase::elements(in_RSI);
  local_58 = &local_68;
  local_68 = sVar3;
  local_70._M_current =
       (Expression **)
       std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                 (in_stack_fffffffffffffd88);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
             in_stack_fffffffffffffd98);
  while( true ) {
    kind = (Kind)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                       (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffd88);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
              ::operator*(&local_70);
    in_stack_fffffffffffffdb0 = Expression::as<slang::ast::AssignmentExpression>(*ppEVar2);
    AssignmentExpression::left(in_stack_fffffffffffffdb0);
    Expression::evalLValue
              (in_stack_fffffffffffffd98,
               (EvalContext *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
    bVar1 = LValue::operator_cast_to_bool((LValue *)0x9c253f);
    in_stack_fffffffffffffda7 = bVar1;
    if (bVar1) {
      std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>::
      emplace_back<slang::ast::LValue>
                ((vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> *)
                 CONCAT17(bVar1,in_stack_fffffffffffffda0),(LValue *)in_stack_fffffffffffffd98);
    }
    else {
      LValue::LValue((LValue *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                     in_stack_fffffffffffffd88);
    }
    LValue::~LValue((LValue *)0x9c25cb);
    if (!bVar1) goto LAB_009c263e;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator++(&local_70);
  }
  not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x9c25f7);
  Type::isIntegral((Type *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
  LValue::LValue((LValue *)sVar3._M_ptr,
                 (vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> *)
                 sVar3._M_extent._M_extent_value._M_extent_value,kind);
LAB_009c263e:
  std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>::~vector
            ((vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> *)
             CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
  return in_RDI;
}

Assistant:

LValue SimpleAssignmentPatternExpression::evalLValueImpl(EvalContext& context) const {
    std::vector<LValue> lvals;
    lvals.reserve(elements().size());
    for (auto elem : elements()) {
        LValue lval = elem->as<AssignmentExpression>().left().evalLValue(context);
        if (!lval)
            return nullptr;

        lvals.emplace_back(std::move(lval));
    }

    auto lvalKind = type->isIntegral() ? LValue::Concat::Packed : LValue::Concat::Unpacked;
    return LValue(std::move(lvals), lvalKind);
}